

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockActualCallTest.cpp
# Opt level: O2

Utest * __thiscall
TEST_MockCheckedActualCall_unExpectedParameterName_TestShell::createTest
          (TEST_MockCheckedActualCall_unExpectedParameterName_TestShell *this)

{
  TEST_MockCheckedActualCall_unExpectedParameterName_Test *this_00;
  
  this_00 = (TEST_MockCheckedActualCall_unExpectedParameterName_Test *)
            operator_new(0x20,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockActualCallTest.cpp"
                         ,0x6c);
  TEST_MockCheckedActualCall_unExpectedParameterName_Test::
  TEST_MockCheckedActualCall_unExpectedParameterName_Test(this_00);
  return (Utest *)this_00;
}

Assistant:

TEST(MockCheckedActualCall, unExpectedParameterName)
{
    MockCheckedExpectedCall call1;
    call1.withName("func");
    list->addExpectedCall(&call1);

    MockCheckedActualCall actualCall(1, reporter, *list);
    actualCall.withName("func").withParameter("integer", 1);

    MockNamedValue parameter("integer");
    parameter.setValue(1);

    MockUnexpectedInputParameterFailure expectedFailure(mockFailureTest(), "func", parameter, *list);
    CHECK_EXPECTED_MOCK_FAILURE(expectedFailure);
}